

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRegistry.h
# Opt level: O2

bool __thiscall
anurbs::TypeEntry<anurbs::BrepTrim,_anurbs::Model>::load
          (TypeEntry<anurbs::BrepTrim,_anurbs::Model> *this,Model *model,Json *source)

{
  __shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Ref<anurbs::BrepTrim> ref;
  Pointer<anurbs::BrepTrim> data;
  string key;
  undefined1 local_88 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2> local_48;
  string local_38;
  
  key_from_json(&local_38,source);
  BrepTrim::load((Model *)local_88,(Json *)model);
  std::__shared_ptr<anurbs::BrepTrim,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<anurbs::BrepTrim,std::default_delete<anurbs::BrepTrim>,void>
            ((__shared_ptr<anurbs::BrepTrim,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             (unique_ptr<anurbs::BrepTrim,_std::default_delete<anurbs::BrepTrim>_> *)local_88);
  std::unique_ptr<anurbs::BrepTrim,_std::default_delete<anurbs::BrepTrim>_>::~unique_ptr
            ((unique_ptr<anurbs::BrepTrim,_std::default_delete<anurbs::BrepTrim>_> *)local_88);
  local_88._0_8_ = (__uniq_ptr_impl<anurbs::BrepTrim,_std::default_delete<anurbs::BrepTrim>_>)0x0;
  local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_38._M_string_length == 0) {
    std::__shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,&local_68);
    Model::add<anurbs::BrepTrim>((Model *)(local_88 + 0x10),(Pointer<anurbs::BrepTrim> *)model);
    std::__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2> *)local_88
               ,(__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2> *)
                (local_88 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
    p_Var1 = &local_48;
  }
  else {
    std::__shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,&local_68);
    Model::add<anurbs::BrepTrim>
              ((Model *)(local_88 + 0x10),(string *)model,(Pointer<anurbs::BrepTrim> *)&local_38);
    std::__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2> *)local_88
               ,(__shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2> *)
                (local_88 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
    p_Var1 = &local_58;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
  std::__shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x10),
             (__shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2> *)(local_88._0_8_ + 0x38)
            );
  Attributes::
  load<anurbs::Model,nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            ((Attributes *)local_88._16_8_,model,source);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  std::__cxx11::string::~string((string *)&local_38);
  return true;
}

Assistant:

bool load(TModel& model, const Json& source) override
    {
        const auto key = key_from_json(source);

        Pointer<TData> data = TData::load(model, source);

        Ref<TData> ref;

        if (key.empty()) {
            ref = model.template add<TData>(data);
        } else {
            ref = model.template add<TData>(key, data);
        }

        ref.attributes()->load(model, source);

        return true;
    }